

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall
CTxMemPool::UpdateForDescendants
          (CTxMemPool *this,txiter updateIt,cacheMap *cachedDescendants,
          set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *setExclude,
          set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *descendants_to_remove)

{
  long lVar1;
  anon_class_24_3_ff538159 mod;
  bool bVar2;
  int32_t iVar3;
  size_type sVar4;
  size_type sVar5;
  uint64_t uVar6;
  int64_t iVar7;
  long in_RDI;
  int64_t in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<uint256>,_bool> pVar8;
  CTxMemPoolEntry *descendant_1;
  Children *__range1;
  int64_t modifyCount;
  CAmount modifyFee;
  int32_t modifySize;
  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  *__range4;
  CTxMemPoolEntry *childEntry;
  Children *__range2;
  Children *children;
  CTxMemPoolEntry *descendant;
  iterator __end1;
  iterator __begin1;
  txiter cacheEntry;
  iterator __end4;
  iterator __begin4;
  iterator cacheIt;
  iterator __end2;
  iterator __begin2;
  Children descendants;
  Children stageEntries;
  CTxMemPoolEntry *in_stack_fffffffffffffc98;
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  *this_00;
  CTxMemPoolEntry *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  txiter in_stack_fffffffffffffcb0;
  iterator in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  uint256 *in_stack_fffffffffffffcd0;
  Txid *in_stack_fffffffffffffcd8;
  int64_t in_stack_fffffffffffffce0;
  int local_1cc;
  undefined4 uStack_16c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::set((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
         *)in_stack_fffffffffffffc98);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::set((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
         *)in_stack_fffffffffffffc98);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)in_stack_fffffffffffffc98);
  CTxMemPoolEntry::GetMemPoolChildrenConst(in_stack_fffffffffffffc98);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::operator=((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)in_stack_fffffffffffffca8,
              (set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)in_stack_fffffffffffffca0);
  while (bVar2 = std::
                 set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 ::empty((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                          *)in_stack_fffffffffffffc98), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::begin((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
             *)in_stack_fffffffffffffca0);
    std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator*
              ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
               in_stack_fffffffffffffc98);
    std::reference_wrapper::operator_cast_to_CTxMemPoolEntry_
              ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffc98);
    std::reference_wrapper<CTxMemPoolEntry_const>::
    reference_wrapper<CTxMemPoolEntry_const&,void,CTxMemPoolEntry_const*>
              ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffca8,
               in_stack_fffffffffffffca0);
    std::
    set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::insert((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
              *)in_stack_fffffffffffffca8,(value_type *)in_stack_fffffffffffffca0);
    std::reference_wrapper<CTxMemPoolEntry_const>::
    reference_wrapper<CTxMemPoolEntry_const&,void,CTxMemPoolEntry_const*>
              ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffca8,
               in_stack_fffffffffffffca0);
    std::
    set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::erase((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
             *)in_stack_fffffffffffffca8,(key_type *)in_stack_fffffffffffffca0);
    CTxMemPoolEntry::GetMemPoolChildrenConst(in_stack_fffffffffffffc98);
    std::
    set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::begin((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
             *)in_stack_fffffffffffffca0);
    std::
    set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::end((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
           *)in_stack_fffffffffffffca0);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffca8,
                                   (_Self *)in_stack_fffffffffffffca0), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator*
                ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
                 in_stack_fffffffffffffc98);
      std::reference_wrapper::operator_cast_to_CTxMemPoolEntry_
                ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffc98);
      boost::multi_index::detail::
      hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
      ::iterator_to((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                     *)in_stack_fffffffffffffcb0.node,in_stack_fffffffffffffca8);
      std::map<$25c3d160$>::find
                ((map<_25c3d160_> *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98)
      ;
      std::map<$25c3d160$>::end((map<_25c3d160_> *)in_stack_fffffffffffffca0);
      bVar2 = std::operator==((_Self *)in_stack_fffffffffffffca8,(_Self *)in_stack_fffffffffffffca0)
      ;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::reference_wrapper<CTxMemPoolEntry_const>::
        reference_wrapper<CTxMemPoolEntry_const&,void,CTxMemPoolEntry_const*>
                  ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffca8,
                   in_stack_fffffffffffffca0);
        sVar4 = std::
                set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                ::count((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                         *)in_stack_fffffffffffffca8,(key_type *)in_stack_fffffffffffffca0);
        if (sVar4 == 0) {
          std::reference_wrapper<CTxMemPoolEntry_const>::
          reference_wrapper<CTxMemPoolEntry_const&,void,CTxMemPoolEntry_const*>
                    ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
          std::
          set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
          ::insert((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                    *)in_stack_fffffffffffffca8,(value_type *)in_stack_fffffffffffffca0);
        }
      }
      else {
        std::_Rb_tree_iterator<$a97c5e44$>::operator->
                  ((_Rb_tree_iterator<_a97c5e44_> *)in_stack_fffffffffffffc98);
        std::
        set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::begin((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 *)in_stack_fffffffffffffca0);
        std::
        set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::end((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
               *)in_stack_fffffffffffffca0);
        while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffca8,
                                       (_Self *)in_stack_fffffffffffffca0),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::
          _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
          ::operator*((_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                       *)in_stack_fffffffffffffc98);
          boost::multi_index::detail::
          hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
          ::operator*((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                       *)in_stack_fffffffffffffc98);
          std::reference_wrapper<CTxMemPoolEntry_const>::
          reference_wrapper<CTxMemPoolEntry_const&,void,CTxMemPoolEntry_const*>
                    ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0);
          std::
          set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
          ::insert((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                    *)in_stack_fffffffffffffca8,(value_type *)in_stack_fffffffffffffca0);
          std::
          _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
          ::operator++((_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                        *)in_stack_fffffffffffffc98);
        }
      }
      std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator++
                ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
                 in_stack_fffffffffffffc98);
    }
  }
  local_1cc = 0;
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::begin((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
           *)in_stack_fffffffffffffca0);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::end((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
         *)in_stack_fffffffffffffca0);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffca8,
                                 (_Self *)in_stack_fffffffffffffca0), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator*
              ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
               in_stack_fffffffffffffc98);
    std::reference_wrapper::operator_cast_to_CTxMemPoolEntry_
              ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffc98);
    CTxMemPoolEntry::GetTx(in_stack_fffffffffffffc98);
    CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffc98);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffffc98);
    sVar5 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                      ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                       in_stack_fffffffffffffca8,(key_type *)in_stack_fffffffffffffca0);
    if (sVar5 == 0) {
      iVar3 = CTxMemPoolEntry::GetTxSize(in_stack_fffffffffffffc98);
      local_1cc = local_1cc + iVar3;
      CTxMemPoolEntry::GetModifiedFee(in_stack_fffffffffffffc98);
      std::map<$25c3d160$>::operator[]
                ((map<_25c3d160_> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
                 (key_type *)in_stack_fffffffffffffcb8.node);
      boost::multi_index::detail::
      hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
      ::iterator_to((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                     *)in_stack_fffffffffffffcb0.node,in_stack_fffffffffffffca8);
      std::
      set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ::insert((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                *)in_stack_fffffffffffffca8,(value_type *)in_stack_fffffffffffffca0);
      boost::multi_index::detail::
      hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
      ::iterator_to((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                     *)in_stack_fffffffffffffcb0.node,in_stack_fffffffffffffca8);
      boost::multi_index::detail::
      hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
      ::
      modify<CTxMemPool::UpdateForDescendants(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::map<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::___,std::allocator<uint256>>const&,std::set<uint256,std::less<uint256>,std::allocator<uint256>>&)::__0>
                ((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                  *)in_stack_fffffffffffffca8,in_stack_fffffffffffffcb8,
                 (anon_class_8_1_36c15952)in_stack_fffffffffffffcb0.node);
      uVar6 = CTxMemPoolEntry::GetCountWithAncestors(in_stack_fffffffffffffc98);
      if ((*(ulong *)(in_RDI + 0x220) < uVar6) ||
         (iVar7 = CTxMemPoolEntry::GetSizeWithAncestors(in_stack_fffffffffffffc98),
         *(long *)(in_RDI + 0x228) < iVar7)) {
        in_stack_fffffffffffffce0 = in_R8;
        CTxMemPoolEntry::GetTx(in_stack_fffffffffffffc98);
        in_stack_fffffffffffffcd8 = CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffc98)
        ;
        in_stack_fffffffffffffcd0 =
             transaction_identifier::operator_cast_to_uint256_
                       ((transaction_identifier<false> *)in_stack_fffffffffffffc98);
        pVar8 = _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::
                insert((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                       in_stack_fffffffffffffca8,(value_type *)in_stack_fffffffffffffca0);
        in_stack_fffffffffffffcc7 = pVar8.second;
      }
    }
    std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator++
              ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
               in_stack_fffffffffffffc98);
  }
  this_00 = (set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
             *)CONCAT44(uStack_16c,local_1cc);
  mod.modifyFee = (CAmount)in_stack_fffffffffffffcd8;
  mod._0_8_ = in_stack_fffffffffffffcd0;
  mod.modifyCount = in_stack_fffffffffffffce0;
  boost::multi_index::detail::
  hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
  ::
  modify<CTxMemPool::UpdateForDescendants(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::map<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::___,std::allocator<uint256>>const&,std::set<uint256,std::less<uint256>,std::allocator<uint256>>&)::__1>
            ((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              *)in_stack_fffffffffffffcb0.node,in_stack_fffffffffffffcb8,mod);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~set(this_00);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~set(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateForDescendants(txiter updateIt, cacheMap& cachedDescendants,
                                      const std::set<uint256>& setExclude, std::set<uint256>& descendants_to_remove)
{
    CTxMemPoolEntry::Children stageEntries, descendants;
    stageEntries = updateIt->GetMemPoolChildrenConst();

    while (!stageEntries.empty()) {
        const CTxMemPoolEntry& descendant = *stageEntries.begin();
        descendants.insert(descendant);
        stageEntries.erase(descendant);
        const CTxMemPoolEntry::Children& children = descendant.GetMemPoolChildrenConst();
        for (const CTxMemPoolEntry& childEntry : children) {
            cacheMap::iterator cacheIt = cachedDescendants.find(mapTx.iterator_to(childEntry));
            if (cacheIt != cachedDescendants.end()) {
                // We've already calculated this one, just add the entries for this set
                // but don't traverse again.
                for (txiter cacheEntry : cacheIt->second) {
                    descendants.insert(*cacheEntry);
                }
            } else if (!descendants.count(childEntry)) {
                // Schedule for later processing
                stageEntries.insert(childEntry);
            }
        }
    }
    // descendants now contains all in-mempool descendants of updateIt.
    // Update and add to cached descendant map
    int32_t modifySize = 0;
    CAmount modifyFee = 0;
    int64_t modifyCount = 0;
    for (const CTxMemPoolEntry& descendant : descendants) {
        if (!setExclude.count(descendant.GetTx().GetHash())) {
            modifySize += descendant.GetTxSize();
            modifyFee += descendant.GetModifiedFee();
            modifyCount++;
            cachedDescendants[updateIt].insert(mapTx.iterator_to(descendant));
            // Update ancestor state for each descendant
            mapTx.modify(mapTx.iterator_to(descendant), [=](CTxMemPoolEntry& e) {
              e.UpdateAncestorState(updateIt->GetTxSize(), updateIt->GetModifiedFee(), 1, updateIt->GetSigOpCost());
            });
            // Don't directly remove the transaction here -- doing so would
            // invalidate iterators in cachedDescendants. Mark it for removal
            // by inserting into descendants_to_remove.
            if (descendant.GetCountWithAncestors() > uint64_t(m_opts.limits.ancestor_count) || descendant.GetSizeWithAncestors() > m_opts.limits.ancestor_size_vbytes) {
                descendants_to_remove.insert(descendant.GetTx().GetHash());
            }
        }
    }
    mapTx.modify(updateIt, [=](CTxMemPoolEntry& e) { e.UpdateDescendantState(modifySize, modifyFee, modifyCount); });
}